

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt_n.hpp
# Opt level: O2

p_range_n * __thiscall
dna_bwt_n<dna_string_n>::LF
          (p_range_n *__return_storage_ptr__,dna_bwt_n<dna_string_n> *this,range_t rn)

{
  p_range_n *ppVar1;
  p_rank_n start;
  p_rank_n l;
  p_rank_n r;
  uint64_t local_b8;
  p_rank_n local_b0;
  p_range_n *local_88;
  p_rank_n local_80;
  p_rank_n local_58;
  
  local_88 = __return_storage_ptr__;
  dna_string_n::parallel_rank(&local_b0,&this->BWT,rn.first);
  if (rn.first < rn.second) {
    dna_string_n::parallel_rank(&local_80,&this->BWT,rn.second);
    local_b8 = local_80.T;
  }
  else {
    local_b8 = local_b0.T;
    local_80.N = local_b0.N;
    local_80.G = local_b0.G;
    local_80.C = local_b0.C;
    local_80.A = local_b0.A;
  }
  ppVar1 = local_88;
  local_80.T = local_b0.T + this->F_T;
  local_58.A = local_80.A + this->F_A;
  local_58.C = local_80.C + this->F_C;
  local_58.G = local_80.G + this->F_G;
  local_58.N = local_80.N + this->F_N;
  local_58.T = local_b8 + this->F_T;
  local_80.A = local_b0.A + this->F_A;
  local_80.C = local_b0.C + this->F_C;
  local_80.G = local_b0.G + this->F_G;
  local_80.N = local_b0.N + this->F_N;
  fold_ranks(&local_80,&local_58);
  return ppVar1;
}

Assistant:

p_range_n LF(range_t rn){

		assert(rn.second >= rn.first);

		//number of A,C,T,G before start of interval
		p_rank_n start = BWT.parallel_rank(rn.first);

		//number of A,C,T,G,N before end of interval (last position of interval included)
		p_rank_n end;

		if(rn.second>rn.first)
			end	= BWT.parallel_rank(rn.second);
		else
			end = start;

		assert(start <= end);

		p_rank_n f = {F_A,F_C,F_G,F_N,F_T};
		p_rank_n l = f + start;
		p_rank_n r = f + end;

		assert(r.A <= l.C);
		assert(r.C <= l.G);
		assert(r.G <= l.N);
		assert(r.N <= l.T);
		assert(l.T <= n);

		return fold_ranks(l,r);

	}